

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

err_t EBML_Init(parsercontext *p)

{
  if (p != (parsercontext *)0x0) {
    (**(code **)((long)(p->Base).Base.Base.VMT + 0x40))(p,0x400,4,"libebml2 v0.21.3");
    NodeRegisterClassEx((nodemodule *)p,EBMLElement_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLMaster_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLBinary_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLString_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLInteger_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLDate_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLCRC_Class);
    NodeRegisterClassEx((nodemodule *)p,EBMLVoid_Class);
    return 0;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                ,0xc,"err_t EBML_Init(parsercontext *)");
}

Assistant:

err_t EBML_Init(parsercontext *p)
{
    Node_SetData(p,CONTEXT_LIBEBML_VERSION,TYPE_STRING,T("libebml2 v") LIBEBML2_PROJECT_VERSION);

    NodeRegisterClassEx(&p->Base.Base,EBMLElement_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLMaster_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLBinary_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLString_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLInteger_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLDate_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLCRC_Class);
    NodeRegisterClassEx(&p->Base.Base,EBMLVoid_Class);

    return ERR_NONE;
}